

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O2

int mbedtls_ccm_starts(mbedtls_ccm_context *ctx,int mode,uchar *iv,size_t iv_len)

{
  int iVar1;
  
  if (iv_len - 0xe < 0xfffffffffffffff9) {
    return -0xd;
  }
  ctx->mode = mode;
  ctx->q = 0xf - (int)iv_len;
  ctx->ctr[0] = '\0';
  ctx->ctr[1] = '\0';
  ctx->ctr[2] = '\0';
  ctx->ctr[3] = '\0';
  ctx->ctr[4] = '\0';
  ctx->ctr[5] = '\0';
  ctx->ctr[6] = '\0';
  ctx->ctr[7] = '\0';
  ctx->ctr[8] = '\0';
  ctx->ctr[9] = '\0';
  ctx->ctr[10] = '\0';
  ctx->ctr[0xb] = '\0';
  ctx->ctr[0xc] = '\0';
  ctx->ctr[0xd] = '\0';
  ctx->ctr[0xe] = '\0';
  ctx->ctr[0xf] = '\0';
  ctx->ctr[0] = '\x0e' - (char)iv_len;
  memcpy(ctx->ctr + 1,iv,iv_len);
  memset(ctx->ctr + iv_len + 1,0,(ulong)ctx->q);
  ctx->ctr[0xf] = '\x01';
  memcpy(ctx->y + 1,iv,iv_len);
  *(byte *)&ctx->state = (byte)ctx->state | 1;
  iVar1 = ccm_calculate_first_block_if_ready(ctx);
  return iVar1;
}

Assistant:

int mbedtls_ccm_starts(mbedtls_ccm_context *ctx,
                       int mode,
                       const unsigned char *iv,
                       size_t iv_len)
{
    /* Also implies q is within bounds */
    if (iv_len < 7 || iv_len > 13) {
        return MBEDTLS_ERR_CCM_BAD_INPUT;
    }

    ctx->mode = mode;
    ctx->q = 16 - 1 - (unsigned char) iv_len;

    /*
     * Prepare counter block for encryption:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       counter (initially 1)
     *
     * With flags as (bits):
     * 7 .. 3   0
     * 2 .. 0   q - 1
     */
    memset(ctx->ctr, 0, 16);
    ctx->ctr[0] = ctx->q - 1;
    memcpy(ctx->ctr + 1, iv, iv_len);
    memset(ctx->ctr + 1 + iv_len, 0, ctx->q);
    ctx->ctr[15] = 1;

    /*
     * See ccm_calculate_first_block_if_ready() for block layout description
     */
    memcpy(ctx->y + 1, iv, iv_len);

    ctx->state |= CCM_STATE__STARTED;
    return ccm_calculate_first_block_if_ready(ctx);
}